

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O1

int arg_parse_list_helper(arg *arg,int *list,int n,char *err_msg)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  char *__format;
  ulong uVar6;
  int iVar7;
  char *__nptr;
  char *endptr;
  char *local_40;
  int *local_38;
  
  __nptr = arg->val;
  if (err_msg != (char *)0x0) {
    *err_msg = '\0';
  }
  iVar7 = 0;
  local_38 = list;
  do {
    if (*__nptr == '\0') {
      return iVar7;
    }
    lVar3 = strtol(__nptr,&local_40,10);
    if ((int)lVar3 == lVar3) {
      if (iVar7 < n) {
        cVar1 = *local_40;
        if (cVar1 != '\0') {
          if (cVar1 != ',') {
            if (err_msg != (char *)0x0) {
              uVar6 = (ulong)(uint)(int)cVar1;
              pcVar5 = arg->name;
              __format = "Option %s: Bad list separator \'%c\'\n";
              goto LAB_00120cdf;
            }
            goto LAB_00120ce8;
          }
          local_40 = local_40 + 1;
        }
        lVar4 = (long)iVar7;
        iVar7 = iVar7 + 1;
        local_38[lVar4] = (int)lVar3;
        bVar2 = true;
        __nptr = local_40;
      }
      else {
        if (err_msg == (char *)0x0) goto LAB_00120ce8;
        pcVar5 = arg->name;
        __format = "Option %s: List has more than %d entries\n";
        uVar6 = (ulong)(uint)n;
LAB_00120cdf:
        bVar2 = false;
        snprintf(err_msg,200,__format,pcVar5,uVar6);
      }
    }
    else if (err_msg == (char *)0x0) {
LAB_00120ce8:
      bVar2 = false;
    }
    else {
      bVar2 = false;
      snprintf(err_msg,200,"Option %s: Value %ld out of range for signed int\n",arg->name,lVar3);
    }
    if (!bVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

int arg_parse_list_helper(const struct arg *arg, int *list, int n,
                          char *err_msg) {
  const char *ptr = arg->val;
  char *endptr;
  int i = 0;

  if (err_msg) err_msg[0] = '\0';

  while (ptr[0] != '\0') {
    long rawval = strtol(ptr, &endptr, 10);  // NOLINT
    if (rawval < INT_MIN || rawval > INT_MAX) {
      SET_ERR_STRING("Option %s: Value %ld out of range for signed int\n",
                     arg->name, rawval);
      return 0;
    } else if (i >= n) {
      SET_ERR_STRING("Option %s: List has more than %d entries\n", arg->name,
                     n);
      return 0;
    } else if (*endptr == ',') {
      endptr++;
    } else if (*endptr != '\0') {
      SET_ERR_STRING("Option %s: Bad list separator '%c'\n", arg->name,
                     *endptr);
      return 0;
    }
    list[i++] = (int)rawval;
    ptr = endptr;
  }
  return i;
}